

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

string * benchmark::(anonymous_namespace)::DateTimeString_abi_cxx11_(bool local)

{
  byte in_SIL;
  string *in_RDI;
  tm timeinfo_1;
  tm timeinfo;
  size_t written;
  char storage [128];
  time_t now;
  string *func;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  uint7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  byte bVar1;
  CheckHandler local_128;
  tm local_120;
  tm local_e8;
  ulong local_b0;
  char local_a8 [136];
  undefined8 local_20;
  time_t local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  func = in_RDI;
  local_20 = std::chrono::_V2::system_clock::now();
  local_18 = std::chrono::_V2::system_clock::to_time_t
                       ((time_point *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0))
  ;
  if ((local_9 & 1) == 0) {
    memset(&local_120,0,0x38);
    gmtime_r(&local_18,&local_120);
    local_b0 = strftime(local_a8,0x80,"%F %T",&local_120);
  }
  else {
    memset(&local_e8,0,0x38);
    localtime_r(&local_18,&local_e8);
    local_b0 = strftime(local_a8,0x80,"%F %T",&local_e8);
  }
  bVar1 = 0;
  if (local_b0 < 0x80) {
    internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              ((CheckHandler *)(ulong)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0,(char *)func,(int)((ulong)in_RDI >> 0x20));
    bVar1 = 1;
    internal::CheckHandler::GetLog(&local_128);
  }
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_a8,(allocator *)&stack0xfffffffffffffed6);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed6);
    return func;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)0x17ee7b);
}

Assistant:

std::string DateTimeString(bool local) {
  typedef std::chrono::system_clock Clock;
  std::time_t now = Clock::to_time_t(Clock::now());
  char storage[128];
  std::size_t written;

  if (local) {
#if defined(BENCHMARK_OS_WINDOWS)
    written = std::strftime(storage, sizeof(storage), "%x %X", ::localtime(&now));
#else
    std::tm timeinfo;
    std::memset(&timeinfo, 0, sizeof(std::tm));
    ::localtime_r(&now, &timeinfo);
    written = std::strftime(storage, sizeof(storage), "%F %T", &timeinfo);
#endif
  } else {
#if defined(BENCHMARK_OS_WINDOWS)
    written = std::strftime(storage, sizeof(storage), "%x %X", ::gmtime(&now));
#else
    std::tm timeinfo;
    std::memset(&timeinfo, 0, sizeof(std::tm));
    ::gmtime_r(&now, &timeinfo);
    written = std::strftime(storage, sizeof(storage), "%F %T", &timeinfo);
#endif
  }
  CHECK(written < arraysize(storage));
  ((void)written); // prevent unused variable in optimized mode.
  return std::string(storage);
}